

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O1

Polynom<Finite> __thiscall Polynom<Finite>::operator*(Polynom<Finite> *this,Finite *f)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDX;
  Finite *extraout_RDX;
  Polynom<Finite> PVar1;
  Polynom<Finite> temp;
  Matrix<Finite> local_60;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  undefined1 local_38;
  Finite local_30;
  
  Matrix<Finite>::Matrix(&local_60,(Matrix<Finite> *)f);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,in_RDX);
  local_38 = *(undefined1 *)
              &in_RDX[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_30,&local_50);
  local_30.val.negative = (bool)local_38;
  Matrix<Finite>::operator*=(&local_60,&local_30);
  if (local_30.val.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_30.val.digits.
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  Matrix<Finite>::Matrix(&this->m,&local_60);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  Matrix<Finite>::~Matrix(&local_60);
  PVar1.m.arr = extraout_RDX;
  PVar1.m._0_8_ = this;
  return (Polynom<Finite>)PVar1.m;
}

Assistant:

inline const Polynom operator*(Field f) const
    {
        Polynom temp(*this);
        return temp *= f;
    }